

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [32];
  __m256i a;
  __m256i alVar4;
  __m256i c;
  __m256i vH_00;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [24];
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  longlong *ptr_02;
  __m256i *ptr_03;
  __m256i *palVar25;
  undefined8 *puVar26;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [32];
  longlong lVar38;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int32_t temp;
  int32_t column_len;
  int64_t *t;
  __m256i vCompare;
  __m256i vFt;
  __m256i vW;
  __m256i *pvW;
  __m256i vHp;
  __m256i vH;
  __m256i vF;
  __m256i vHt;
  __m256i vE;
  __m256i vGapper;
  parasail_result_t *result;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t score;
  __m256i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapper;
  __m256i *pvHMax;
  __m256i *pvH;
  __m256i *pvHt;
  __m256i *pvE;
  __m256i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  undefined4 in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff464;
  long lVar61;
  int32_t in_stack_fffffffffffff470;
  int32_t in_stack_fffffffffffff474;
  undefined8 in_stack_fffffffffffff478;
  longlong *plVar62;
  undefined8 in_stack_fffffffffffff480;
  undefined8 in_stack_fffffffffffff488;
  longlong in_stack_fffffffffffff490;
  long lStack_b68;
  int *in_stack_fffffffffffff4a0;
  __m256i *in_stack_fffffffffffff4b0;
  undefined8 in_stack_fffffffffffff4b8;
  undefined8 in_stack_fffffffffffff4c0;
  undefined8 in_stack_fffffffffffff4c8;
  longlong in_stack_fffffffffffff4d0;
  longlong in_stack_fffffffffffff4d8;
  undefined1 in_stack_fffffffffffff4e0 [24];
  __m256i local_b00;
  longlong local_ae0;
  longlong lStack_ad8;
  longlong lStack_ad0;
  longlong lStack_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  longlong local_a80;
  longlong lStack_a78;
  longlong lStack_a70;
  longlong lStack_a68;
  undefined1 local_a60 [32];
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  longlong local_9c0;
  longlong lStack_9b8;
  longlong lStack_9b0;
  longlong lStack_9a8;
  longlong local_9a0;
  longlong lStack_998;
  longlong lStack_990;
  longlong lStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  ulong local_908;
  int local_834;
  int local_830;
  int local_82c;
  int local_828;
  parasail_result_t *local_808;
  ulong uStack_7b8;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  longlong local_1c0;
  longlong lStack_1b8;
  longlong lStack_1b0;
  longlong lStack_1a8;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_avx2_256_64","profile");
    local_808 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_avx2_256_64",
            "profile->profile64.score");
    local_808 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_avx2_256_64",
            "profile->matrix");
    local_808 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_avx2_256_64",
            "profile->s1Len");
    local_808 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_avx2_256_64","s2");
    local_808 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_avx2_256_64","s2Len");
    local_808 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_avx2_256_64","open");
    local_808 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_avx2_256_64","gap");
    local_808 = (parasail_result_t *)0x0;
  }
  else {
    local_834 = 0;
    local_830 = *(int *)(in_RDI + 8);
    lVar1 = *(long *)(in_RDI + 0x10);
    iVar20 = (local_830 + 3) / 4;
    lVar2 = *(long *)(in_RDI + 0x60);
    uVar22 = (ulong)in_ECX;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar22;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar22;
    auVar27 = vpunpcklqdq_avx(auVar27,auVar37);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar22;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar22;
    auVar36 = vpunpcklqdq_avx(auVar39,auVar45);
    uStack_230 = auVar36._0_8_;
    uStack_228 = auVar36._8_8_;
    uVar22 = (ulong)in_R8D;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar22;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar22;
    auVar36 = vpunpcklqdq_avx(auVar36,auVar34);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar22;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar22;
    auVar28 = vpunpcklqdq_avx(auVar28,auVar46);
    auVar28 = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar28;
    auVar36 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar36;
    uStack_1f0 = auVar36._0_8_;
    uStack_1e8 = auVar36._8_8_;
    if (-in_ECX < *(int *)(lVar1 + 0x20)) {
      lVar23 = (long)in_ECX;
    }
    else {
      lVar23 = -(long)*(int *)(lVar1 + 0x20);
    }
    lVar61 = lVar23 + -0x8000000000000000;
    uVar22 = lVar23 + 0x8000000000000001;
    uVar24 = 0x7ffffffffffffffe - (long)*(int *)(lVar1 + 0x1c);
    uStack_7b8 = SUB328(ZEXT832(0),4);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar22;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar22;
    auVar36 = vpunpcklqdq_avx(auVar29,auVar40);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar22;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar22;
    auVar37 = vpunpcklqdq_avx(auVar41,auVar47);
    local_1c0 = auVar36._0_8_;
    lStack_1b8 = auVar36._8_8_;
    lStack_1b0 = auVar37._0_8_;
    lStack_1a8 = auVar37._8_8_;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar24;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar24;
    auVar39 = vpunpcklqdq_avx(auVar30,auVar42);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar24;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar24;
    auVar34 = vpunpcklqdq_avx(auVar43,auVar48);
    local_180 = auVar39._0_8_;
    uStack_178 = auVar39._8_8_;
    uStack_170 = auVar34._0_8_;
    uStack_168 = auVar34._8_8_;
    local_980 = local_180;
    uStack_978 = uStack_178;
    uStack_970 = uStack_170;
    uStack_968 = uStack_168;
    local_9a0 = local_1c0;
    lStack_998 = lStack_1b8;
    lStack_990 = lStack_1b0;
    lStack_988 = lStack_1a8;
    local_9c0 = local_1c0;
    lStack_9b8 = lStack_1b8;
    lStack_9b0 = lStack_1b0;
    lStack_9a8 = lStack_1a8;
    uVar24 = (ulong)(-iVar20 * in_R8D);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar24;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar24;
    auVar34 = vpunpcklqdq_avx(auVar31,auVar49);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar24;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar24;
    auVar45 = vpunpcklqdq_avx(auVar50,auVar54);
    auVar35._16_16_ = auVar45;
    auVar35._0_16_ = auVar34;
    uVar24 = (ulong)(-iVar20 * in_R8D);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar24;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar24;
    auVar34 = vpunpcklqdq_avx(auVar51,auVar55);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar24;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar24;
    auVar45 = vpunpcklqdq_avx(auVar56,auVar57);
    auVar3._16_16_ = auVar45;
    auVar3._0_16_ = auVar34;
    uVar24 = (ulong)(-iVar20 * in_R8D);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar24;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar24;
    auVar34 = vpunpcklqdq_avx(auVar52,auVar58);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar24;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar24;
    vpunpcklqdq_avx(auVar59,auVar60);
    auVar3 = vperm2i128_avx2(ZEXT1632(auVar34),auVar3,0x28);
    auVar3 = vpalignr_avx2(auVar35,auVar3,8);
    auVar3 = vpaddq_avx2(ZEXT1632(CONCAT88(uStack_7b8,uVar22)),auVar3);
    local_808 = parasail_result_new_table1(iVar20 * 4,in_EDX);
    if (local_808 == (parasail_result_t *)0x0) {
      local_808 = (parasail_result_t *)0x0;
    }
    else {
      local_808->flag = local_808->flag | 0x4800404;
      local_808->flag = local_808->flag | 0x20000;
      ptr = parasail_memalign___m256i(0x20,(long)iVar20);
      ptr_00 = parasail_memalign___m256i(0x20,(long)iVar20);
      ptr_01 = parasail_memalign___m256i(0x20,(long)iVar20);
      ptr_02 = *parasail_memalign___m256i(0x20,(long)iVar20);
      ptr_03 = parasail_memalign___m256i(0x20,(long)iVar20);
      if (ptr == (__m256i *)0x0) {
        local_808 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (__m256i *)0x0) {
        local_808 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (__m256i *)0x0) {
        local_808 = (parasail_result_t *)0x0;
      }
      else if ((__m256i *)ptr_02 == (__m256i *)0x0) {
        local_808 = (parasail_result_t *)0x0;
      }
      else if (ptr_03 == (__m256i *)0x0) {
        local_808 = (parasail_result_t *)0x0;
      }
      else {
        alVar4[1] = in_stack_fffffffffffff480;
        alVar4[0] = in_stack_fffffffffffff478;
        alVar4[2] = in_stack_fffffffffffff488;
        alVar4[3] = in_stack_fffffffffffff490;
        parasail_memset___m256i
                  (in_stack_fffffffffffff4b0,alVar4,
                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
        c[1] = in_stack_fffffffffffff480;
        c[0] = in_stack_fffffffffffff478;
        c[2] = in_stack_fffffffffffff488;
        c[3] = in_stack_fffffffffffff490;
        parasail_memset___m256i
                  (in_stack_fffffffffffff4b0,c,
                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
        auVar12._16_8_ = uStack_230;
        auVar12._0_16_ = auVar27;
        auVar12._24_8_ = uStack_228;
        local_a60 = vpsubq_avx2(ZEXT832(uStack_7b8) << 0x40,auVar12);
        local_828 = iVar20;
        while (local_828 = local_828 + -1, -1 < local_828) {
          palVar25 = ptr_03 + local_828;
          (*palVar25)[0] = local_a60._0_8_;
          (*palVar25)[1] = local_a60._8_8_;
          (*palVar25)[2] = local_a60._16_8_;
          (*palVar25)[3] = local_a60._24_8_;
          auVar11._16_8_ = uStack_1f0;
          auVar11._0_16_ = auVar28;
          auVar11._24_8_ = uStack_1e8;
          local_a60 = vpsubq_avx2(local_a60,auVar11);
        }
        local_82c = 0;
        local_908 = uVar22;
        auVar34 = auVar36;
        while( true ) {
          uStack_9c8 = auVar37._8_8_;
          uStack_9d0 = auVar37._0_8_;
          if (in_EDX <= local_82c) break;
          auVar35 = vpermq_avx2((undefined1  [32])ptr_01[iVar20 + -1],0x90);
          local_b00 = (__m256i)vpblendd_avx2(auVar35,ZEXT1632(ZEXT816(0) << 0x40),3);
          iVar21 = *(int *)(*(long *)(lVar1 + 0x10) + (ulong)*(byte *)(in_RSI + local_82c) * 4);
          local_aa0 = ZEXT832(uStack_7b8) << 0x40;
          local_ac0._16_8_ = lStack_1b0;
          local_ac0._0_16_ = auVar36;
          local_ac0._24_8_ = lStack_1a8;
          local_828 = 0;
          while( true ) {
            if (iVar20 <= local_828) break;
            alVar4 = ptr_01[local_828];
            puVar26 = (undefined8 *)
                      (lVar2 + (long)(iVar21 * iVar20) * 0x20 + (long)local_828 * 0x20);
            in_stack_fffffffffffff4c0 = *puVar26;
            in_stack_fffffffffffff4c8 = puVar26[1];
            in_stack_fffffffffffff4d0 = puVar26[2];
            in_stack_fffffffffffff4d8 = puVar26[3];
            auVar10._16_8_ = uStack_1f0;
            auVar10._0_16_ = auVar28;
            auVar10._24_8_ = uStack_1e8;
            auVar35 = vpsubq_avx2((undefined1  [32])ptr[local_828],auVar10);
            auVar9._16_8_ = uStack_230;
            auVar9._0_16_ = auVar27;
            auVar9._24_8_ = uStack_228;
            vpsubq_avx2((undefined1  [32])ptr_01[local_828],auVar9);
            a_00[1] = in_stack_fffffffffffff4e0._0_8_;
            a_00[2] = in_stack_fffffffffffff4e0._8_8_;
            a_00[3] = in_stack_fffffffffffff4e0._16_8_;
            a_00[0] = in_stack_fffffffffffff4d8;
            b[1] = in_stack_fffffffffffff4c0;
            b[0] = in_stack_fffffffffffff4b8;
            b[2] = in_stack_fffffffffffff4c8;
            b[3] = in_stack_fffffffffffff4d0;
            _mm256_max_epi64_rpl(a_00,b);
            auVar5._8_8_ = in_stack_fffffffffffff4c8;
            auVar5._0_8_ = in_stack_fffffffffffff4c0;
            auVar5._16_8_ = in_stack_fffffffffffff4d0;
            auVar5._24_8_ = in_stack_fffffffffffff4d8;
            vpaddq_avx2((undefined1  [32])local_b00,auVar5);
            vpaddq_avx2(local_aa0,(undefined1  [32])ptr_03[local_828]);
            a_01[1] = in_stack_fffffffffffff4e0._0_8_;
            a_01[2] = in_stack_fffffffffffff4e0._8_8_;
            a_01[3] = in_stack_fffffffffffff4e0._16_8_;
            a_01[0] = in_stack_fffffffffffff4d8;
            b_00[1] = in_stack_fffffffffffff4c0;
            b_00[0] = in_stack_fffffffffffff4b8;
            b_00[2] = in_stack_fffffffffffff4c8;
            b_00[3] = in_stack_fffffffffffff4d0;
            _mm256_max_epi64_rpl(a_01,b_00);
            local_a80 = auVar35._0_8_;
            lStack_a78 = auVar35._8_8_;
            lStack_a70 = auVar35._16_8_;
            lStack_a68 = auVar35._24_8_;
            a_02[1] = in_stack_fffffffffffff4e0._0_8_;
            a_02[2] = in_stack_fffffffffffff4e0._8_8_;
            a_02[3] = in_stack_fffffffffffff4e0._16_8_;
            a_02[0] = in_stack_fffffffffffff4d8;
            b_01[1] = in_stack_fffffffffffff4c0;
            b_01[0] = in_stack_fffffffffffff4b8;
            b_01[2] = in_stack_fffffffffffff4c8;
            b_01[3] = in_stack_fffffffffffff4d0;
            local_aa0._0_8_ = local_a80;
            local_aa0._8_8_ = lStack_a78;
            local_aa0._16_8_ = lStack_a70;
            local_aa0._24_8_ = lStack_a68;
            _mm256_max_epi64_rpl(a_02,b_01);
            palVar25 = ptr + local_828;
            (*palVar25)[0] = local_a80;
            (*palVar25)[1] = lStack_a78;
            (*palVar25)[2] = lStack_a70;
            (*palVar25)[3] = lStack_a68;
            palVar25 = ptr_00 + local_828;
            (*palVar25)[0] = local_aa0._0_8_;
            (*palVar25)[1] = local_aa0._8_8_;
            (*palVar25)[2] = local_aa0._16_8_;
            (*palVar25)[3] = local_aa0._24_8_;
            local_828 = local_828 + 1;
            local_b00 = alVar4;
          }
          auVar35 = vpermq_avx2(local_aa0,0x90);
          auVar35 = vpblendd_avx2(auVar35,ZEXT1632(ZEXT816(0) << 0x40),3);
          local_aa0._0_8_ = auVar35._0_8_;
          local_aa0._8_8_ = auVar35._8_8_;
          local_aa0._16_8_ = auVar35._16_8_;
          local_aa0._24_8_ = auVar35._24_8_;
          vpaddq_avx2(auVar35,(undefined1  [32])*ptr_03);
          a_03[1] = in_stack_fffffffffffff4e0._0_8_;
          a_03[2] = in_stack_fffffffffffff4e0._8_8_;
          a_03[3] = in_stack_fffffffffffff4e0._16_8_;
          a_03[0] = in_stack_fffffffffffff4d8;
          b_02[1] = in_stack_fffffffffffff4c0;
          b_02[0] = in_stack_fffffffffffff4b8;
          b_02[2] = in_stack_fffffffffffff4c8;
          b_02[3] = in_stack_fffffffffffff4d0;
          _mm256_max_epi64_rpl(a_03,b_02);
          for (local_828 = 0; local_828 < 2; local_828 = local_828 + 1) {
            auVar35 = vpermq_avx2(local_ac0,0x90);
            auVar35 = vpblendd_avx2(auVar35,ZEXT832(0),3);
            auVar35 = vpaddq_avx2(auVar35,auVar3);
            in_stack_fffffffffffff4a0 = auVar35._0_8_;
            in_stack_fffffffffffff4b8 = auVar35._24_8_;
            a_04[1] = in_stack_fffffffffffff4e0._0_8_;
            a_04[2] = in_stack_fffffffffffff4e0._8_8_;
            a_04[3] = in_stack_fffffffffffff4e0._16_8_;
            a_04[0] = in_stack_fffffffffffff4d8;
            b_03[1] = in_stack_fffffffffffff4c0;
            b_03[0] = in_stack_fffffffffffff4b8;
            b_03[2] = in_stack_fffffffffffff4c8;
            b_03[3] = in_stack_fffffffffffff4d0;
            _mm256_max_epi64_rpl(a_04,b_03);
          }
          auVar35 = vpermq_avx2(local_ac0,0x90);
          auVar35 = vpblendd_avx2(auVar35,ZEXT832(0),3);
          local_ac0 = vpaddq_avx2(auVar35,ZEXT1632(CONCAT88(uStack_7b8,uVar22)));
          a_05[1] = in_stack_fffffffffffff4e0._0_8_;
          a_05[2] = in_stack_fffffffffffff4e0._8_8_;
          a_05[3] = in_stack_fffffffffffff4e0._16_8_;
          a_05[0] = in_stack_fffffffffffff4d8;
          b_04[1] = in_stack_fffffffffffff4c0;
          b_04[0] = in_stack_fffffffffffff4b8;
          b_04[2] = in_stack_fffffffffffff4c8;
          b_04[3] = in_stack_fffffffffffff4d0;
          _mm256_max_epi64_rpl(a_05,b_04);
          a_06[1] = in_stack_fffffffffffff4e0._0_8_;
          a_06[2] = in_stack_fffffffffffff4e0._8_8_;
          a_06[3] = in_stack_fffffffffffff4e0._16_8_;
          a_06[0] = in_stack_fffffffffffff4d8;
          b_05[1] = in_stack_fffffffffffff4c0;
          b_05[0] = in_stack_fffffffffffff4b8;
          b_05[2] = in_stack_fffffffffffff4c8;
          b_05[3] = in_stack_fffffffffffff4d0;
          _mm256_max_epi64_rpl(a_06,b_05);
          local_828 = 0;
          local_ae0 = local_aa0._0_8_;
          lStack_ad8 = local_aa0._8_8_;
          lStack_ad0 = local_aa0._16_8_;
          lStack_ac8 = local_aa0._24_8_;
          while( true ) {
            if (iVar20 <= local_828) break;
            auVar19 = *(undefined1 (*) [24])ptr_00[local_828];
            lVar38 = ptr_00[local_828][3];
            auVar8._16_8_ = uStack_1f0;
            auVar8._0_16_ = auVar28;
            auVar8._24_8_ = uStack_1e8;
            local_ac0 = vpsubq_avx2(local_ac0,auVar8);
            auVar7._8_8_ = lStack_ad8;
            auVar7._0_8_ = local_ae0;
            auVar7._16_8_ = lStack_ad0;
            auVar7._24_8_ = lStack_ac8;
            auVar6._16_8_ = uStack_230;
            auVar6._0_16_ = auVar27;
            auVar6._24_8_ = uStack_228;
            vpsubq_avx2(auVar7,auVar6);
            a_07[1] = in_stack_fffffffffffff4e0._0_8_;
            a_07[2] = in_stack_fffffffffffff4e0._8_8_;
            a_07[3] = in_stack_fffffffffffff4e0._16_8_;
            a_07[0] = in_stack_fffffffffffff4d8;
            b_06[1] = in_stack_fffffffffffff4c0;
            b_06[0] = in_stack_fffffffffffff4b8;
            b_06[2] = in_stack_fffffffffffff4c8;
            b_06[3] = in_stack_fffffffffffff4d0;
            _mm256_max_epi64_rpl(a_07,b_06);
            local_aa0._0_8_ = auVar19._0_8_;
            local_aa0._8_8_ = auVar19._8_8_;
            local_aa0._16_8_ = auVar19._16_8_;
            a_08[1] = in_stack_fffffffffffff4e0._0_8_;
            a_08[2] = in_stack_fffffffffffff4e0._8_8_;
            a_08[3] = in_stack_fffffffffffff4e0._16_8_;
            a_08[0] = in_stack_fffffffffffff4d8;
            b_07[1] = in_stack_fffffffffffff4c0;
            b_07[0] = in_stack_fffffffffffff4b8;
            b_07[2] = in_stack_fffffffffffff4c8;
            b_07[3] = in_stack_fffffffffffff4d0;
            _mm256_max_epi64_rpl(a_08,b_07);
            a_09[1] = in_stack_fffffffffffff4e0._0_8_;
            a_09[2] = in_stack_fffffffffffff4e0._8_8_;
            a_09[3] = in_stack_fffffffffffff4e0._16_8_;
            a_09[0] = in_stack_fffffffffffff4d8;
            b_08[1] = in_stack_fffffffffffff4c0;
            b_08[0] = in_stack_fffffffffffff4b8;
            b_08[2] = in_stack_fffffffffffff4c8;
            b_08[3] = in_stack_fffffffffffff4d0;
            _mm256_max_epi64_rpl(a_09,b_08);
            palVar25 = ptr_01 + local_828;
            (*palVar25)[0] = local_aa0._0_8_;
            (*palVar25)[1] = local_aa0._8_8_;
            (*palVar25)[2] = local_aa0._16_8_;
            (*palVar25)[3] = lVar38;
            a_10[1] = in_stack_fffffffffffff4e0._0_8_;
            a_10[2] = in_stack_fffffffffffff4e0._8_8_;
            a_10[3] = in_stack_fffffffffffff4e0._16_8_;
            a_10[0] = in_stack_fffffffffffff4d8;
            b_09[1] = in_stack_fffffffffffff4c0;
            b_09[0] = in_stack_fffffffffffff4b8;
            b_09[2] = in_stack_fffffffffffff4c8;
            b_09[3] = in_stack_fffffffffffff4d0;
            _mm256_min_epi64_rpl(a_10,b_09);
            a_11[1] = in_stack_fffffffffffff4e0._0_8_;
            a_11[2] = in_stack_fffffffffffff4e0._8_8_;
            a_11[3] = in_stack_fffffffffffff4e0._16_8_;
            a_11[0] = in_stack_fffffffffffff4d8;
            b_10[1] = in_stack_fffffffffffff4c0;
            b_10[0] = in_stack_fffffffffffff4b8;
            b_10[2] = in_stack_fffffffffffff4c8;
            b_10[3] = in_stack_fffffffffffff4d0;
            _mm256_max_epi64_rpl(a_11,b_10);
            vH_00[1] = in_stack_fffffffffffff480;
            vH_00[0] = in_stack_fffffffffffff478;
            vH_00[2] = in_stack_fffffffffffff488;
            vH_00[3] = in_stack_fffffffffffff490;
            arr_store_si256(in_stack_fffffffffffff4a0,vH_00,in_stack_fffffffffffff474,
                            in_stack_fffffffffffff470,(int32_t)((ulong)lVar61 >> 0x20),
                            (int32_t)lVar61);
            a_12[1] = in_stack_fffffffffffff4e0._0_8_;
            a_12[2] = in_stack_fffffffffffff4e0._8_8_;
            a_12[3] = in_stack_fffffffffffff4e0._16_8_;
            a_12[0] = in_stack_fffffffffffff4d8;
            b_11[1] = in_stack_fffffffffffff4c0;
            b_11[0] = in_stack_fffffffffffff4b8;
            b_11[2] = in_stack_fffffffffffff4c8;
            b_11[3] = in_stack_fffffffffffff4d0;
            local_9c0 = local_aa0._0_8_;
            lStack_9b8 = local_aa0._8_8_;
            lStack_9b0 = local_aa0._16_8_;
            lStack_9a8 = lVar38;
            _mm256_max_epi64_rpl(a_12,b_11);
            local_828 = local_828 + 1;
            local_ae0 = local_aa0._0_8_;
            lStack_ad8 = local_aa0._8_8_;
            lStack_ad0 = local_aa0._16_8_;
            lStack_ac8 = lVar38;
          }
          auVar18._8_8_ = lStack_9b8;
          auVar18._0_8_ = local_9c0;
          auVar18._16_8_ = lStack_9b0;
          auVar18._24_8_ = lStack_9a8;
          auVar17._16_8_ = uStack_9d0;
          auVar17._0_16_ = auVar34;
          auVar17._24_8_ = uStack_9c8;
          auVar35 = vpcmpgtq_avx2(auVar18,auVar17);
          in_stack_fffffffffffff480 = auVar35._0_8_;
          in_stack_fffffffffffff488 = auVar35._8_8_;
          in_stack_fffffffffffff490 = auVar35._16_8_;
          lStack_b68 = auVar35._24_8_;
          if ((((((((((((((((((((((((((((((((auVar35 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar35 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar35 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar35 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar35 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar35 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar35 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar35 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar35 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar35 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar35 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar35 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar35 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar35 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar35 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar35 >> 0x7f,0) != '\0') ||
                            (auVar35 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar35 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar35 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar35 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar35 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar35 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar35 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar35 >> 0xbf,0) != '\0') ||
                    (auVar35 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar35 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar35 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar35 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar35 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar35 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_b68 < 0)
          {
            a[1]._0_4_ = in_stack_fffffffffffff460;
            a[0] = 0xc8d6fe;
            a[1]._4_4_ = in_stack_fffffffffffff464;
            a[2]._0_4_ = (int)lVar61;
            a[2]._4_4_ = (int)((ulong)lVar61 >> 0x20);
            a[3]._0_4_ = in_stack_fffffffffffff470;
            a[3]._4_4_ = in_stack_fffffffffffff474;
            local_908 = _mm256_hmax_epi64_rpl(a);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = local_908;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = local_908;
            auVar37 = vpunpcklqdq_avx(auVar32,auVar44);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = local_908;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = local_908;
            auVar34 = vpunpcklqdq_avx(auVar33,auVar53);
            auVar34 = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar34;
            auVar37 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar37;
            local_834 = local_82c;
            memcpy(ptr_02,ptr_01,(long)iVar20 << 5);
          }
          local_82c = local_82c + 1;
        }
        plVar62 = ptr_02;
        for (local_828 = 0; local_828 < iVar20 * 4; local_828 = local_828 + 1) {
          if ((*plVar62 == local_908) &&
             (iVar21 = local_828 / 4 + (local_828 % 4) * iVar20, iVar21 < local_830)) {
            local_830 = iVar21;
          }
          plVar62 = plVar62 + 1;
        }
        auVar16._16_8_ = lStack_1b0;
        auVar16._0_16_ = auVar36;
        auVar16._24_8_ = lStack_1a8;
        auVar15._8_8_ = uStack_978;
        auVar15._0_8_ = local_980;
        auVar15._16_8_ = uStack_970;
        auVar15._24_8_ = uStack_968;
        auVar3 = vpcmpgtq_avx2(auVar16,auVar15);
        auVar14._8_8_ = lStack_998;
        auVar14._0_8_ = local_9a0;
        auVar14._16_8_ = lStack_990;
        auVar14._24_8_ = lStack_988;
        auVar13._16_8_ = uStack_170;
        auVar13._0_16_ = auVar39;
        auVar13._24_8_ = uStack_168;
        auVar35 = vpcmpgtq_avx2(auVar14,auVar13);
        auVar3 = vpor_avx2(auVar3,auVar35);
        if ((((((((((((((((((((((((((((((((auVar3 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar3 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar3 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar3 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar3 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar3 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar3 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar3 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar3 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar3 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar3 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar3 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar3 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar3 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar3 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar3 >> 0x7f,0) != '\0') ||
                          (auVar3 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar3 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar3 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar3 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar3 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar3 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar3 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar3 >> 0xbf,0) != '\0') ||
                  (auVar3 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar3 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar3 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar3 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar3 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar3 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar3 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar3[0x1f] < '\0') {
          local_808->flag = local_808->flag | 0x40;
          local_908 = 0;
          local_830 = 0;
          local_834 = 0;
        }
        local_808->score = (int)local_908;
        local_808->end_query = local_830;
        local_808->end_ref = local_834;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return local_808;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        vH = _mm256_max_epi64_rpl(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int64_t *t = (int64_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}